

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ2(TPZDecomposed *this,TFad<6,_double> *J2)

{
  TFad<6,_double> *pTVar1;
  long lVar2;
  int i;
  int i_2;
  value_type vVar3;
  TFad<6,_double> sig3;
  TFad<6,_double> sig2;
  TFad<6,_double> sig1;
  TFad<6,_double> *local_200;
  TFad<6,_double> *local_1f8;
  TFad<6,_double> *local_1f0;
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>
  local_1e8;
  TFad<6,_double> local_1d8;
  TFad<6,_double> local_198;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_> local_158;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_148;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_138;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>
  local_128;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_118;
  TFad<6,_double> **local_108;
  TFad<6,_double> *local_100;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_f8;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_e8;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_d8;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>
  local_c8;
  TFad<6,_double> **local_b8;
  TFad<6,_double> *local_b0;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_a8;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_98;
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_88;
  TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>
  local_78;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>
  local_68;
  TFad<6,_double> local_58;
  
  local_200 = &local_58;
  local_58.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_58.val_ = 0.0;
  local_58.dx_[0] = 0.0;
  local_58.dx_[1] = 0.0;
  local_58.dx_[2] = 0.0;
  local_58.dx_[3] = 0.0;
  local_58.dx_[4] = 0.0;
  local_58.dx_[5] = 0.0;
  local_198.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_198.val_ = 0.0;
  local_198.dx_[0] = 0.0;
  local_198.dx_[1] = 0.0;
  local_198.dx_[2] = 0.0;
  local_198.dx_[3] = 0.0;
  local_198.dx_[4] = 0.0;
  local_198.dx_[5] = 0.0;
  local_1d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  local_1d8.val_ = 0.0;
  local_1d8.dx_[0] = 0.0;
  local_1d8.dx_[1] = 0.0;
  local_1d8.dx_[2] = 0.0;
  local_1d8.dx_[3] = 0.0;
  local_1d8.dx_[4] = 0.0;
  local_1d8.dx_[5] = 0.0;
  pTVar1 = (this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore;
  if (local_200 != pTVar1) {
    lVar2 = 2;
    do {
      local_58.dx_[lVar2 + -2] = pTVar1->dx_[lVar2 + -2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    local_58.val_ = pTVar1->val_;
  }
  local_158.fadexpr_.right_ = &local_198;
  if (local_158.fadexpr_.right_ != pTVar1 + 1) {
    lVar2 = 0;
    do {
      local_198.dx_[lVar2] = pTVar1[1].dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    local_198.val_ = pTVar1[1].val_;
  }
  local_148.fadexpr_.right_ = &local_1d8;
  if (local_148.fadexpr_.right_ != pTVar1 + 2) {
    lVar2 = 0;
    do {
      local_1d8.dx_[lVar2] = pTVar1[2].dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    local_1d8.val_ = pTVar1[2].val_;
  }
  local_b8 = &local_1f0;
  local_a8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_> *)
       &local_b8;
  local_98.fadexpr_.left_ = &local_a8;
  local_88.fadexpr_.right_ = &local_98;
  local_98.fadexpr_.right_.constant_ = 3.0;
  local_78.fadexpr_.left_ = &local_88;
  local_68.fadexpr_.left_ = &local_78;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_108 = &local_1f8;
  local_f8.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_> *)
       &local_108;
  local_e8.fadexpr_.left_ = &local_f8;
  local_d8.fadexpr_.right_ = &local_e8;
  local_e8.fadexpr_.right_.constant_ = 3.0;
  local_c8.fadexpr_.left_ = &local_d8;
  local_68.fadexpr_.right_ = &local_c8;
  local_c8.fadexpr_.right_.constant_ = 2.0;
  local_1e8.left_ = &local_68;
  local_158.fadexpr_.left_ = (TFadExpr<TFadUnaryMin<TFad<6,_double>_>_> *)&local_200;
  local_148.fadexpr_.left_ = &local_158;
  local_138.fadexpr_.left_ = &local_148;
  local_128.fadexpr_.left_ = &local_138;
  local_138.fadexpr_.right_.constant_ = 3.0;
  local_118.fadexpr_.left_ = &local_128;
  local_1e8.right_ = &local_118;
  local_118.fadexpr_.right_.constant_ = 2.0;
  lVar2 = 0;
  local_1f8 = local_200;
  local_1f0 = local_200;
  local_128.fadexpr_.right_ = local_148.fadexpr_.right_;
  local_100 = local_158.fadexpr_.right_;
  local_f8.fadexpr_.right_ = local_148.fadexpr_.right_;
  local_d8.fadexpr_.left_ = local_158.fadexpr_.right_;
  local_b0 = local_158.fadexpr_.right_;
  local_a8.fadexpr_.right_ = local_148.fadexpr_.right_;
  local_88.fadexpr_.left_ = local_200;
  do {
    vVar3 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>
            ::dx(&local_1e8,(int)lVar2);
    J2->dx_[lVar2] = vVar3 * 0.5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  vVar3 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryPow<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>
          ::val(&local_1e8);
  J2->val_ = vVar3 * 0.5;
  return;
}

Assistant:

void ComputeJ2(T & J2) {
            T sig1, sig2, sig3;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            J2 = (pow(sig1 + (-sig1 - sig2 - sig3) / 3., 2) + pow(sig2 + (-sig1 - sig2 - sig3) / 3., 2) + pow((-sig1 - sig2 - sig3) / 3. + sig3, 2)) / 2.;
        }